

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_parsednumber.cpp
# Opt level: O0

double __thiscall icu_63::numparse::impl::ParsedNumber::getDouble(ParsedNumber *this)

{
  bool bVar1;
  int64_t iVar2;
  bool sawInfinity;
  bool sawNaN;
  ParsedNumber *this_local;
  
  if ((this->flags & 0x40U) == 0) {
    if ((this->flags & 0x80U) == 0) {
      bVar1 = icu_63::number::impl::DecimalQuantity::isZero(&this->quantity);
      if ((bVar1) &&
         (bVar1 = icu_63::number::impl::DecimalQuantity::isNegative(&this->quantity), bVar1)) {
        this_local = (ParsedNumber *)0x8000000000000000;
      }
      else {
        bVar1 = icu_63::number::impl::DecimalQuantity::fitsInLong(&this->quantity,false);
        if (bVar1) {
          iVar2 = icu_63::number::impl::DecimalQuantity::toLong(&this->quantity,false);
          this_local = (ParsedNumber *)(double)iVar2;
        }
        else {
          this_local = (ParsedNumber *)
                       icu_63::number::impl::DecimalQuantity::toDouble(&this->quantity);
        }
      }
    }
    else if ((this->flags & 1U) == 0) {
      this_local = (ParsedNumber *)0x7ff0000000000000;
    }
    else {
      this_local = (ParsedNumber *)0xfff0000000000000;
    }
  }
  else {
    this_local = (ParsedNumber *)uprv_getNaN_63();
  }
  return (double)this_local;
}

Assistant:

double ParsedNumber::getDouble() const {
    bool sawNaN = 0 != (flags & FLAG_NAN);
    bool sawInfinity = 0 != (flags & FLAG_INFINITY);

    // Check for NaN, infinity, and -0.0
    if (sawNaN) {
        // Can't use NAN or std::nan because the byte pattern is platform-dependent;
        // MSVC sets the sign bit, but Clang and GCC do not
        return uprv_getNaN();
    }
    if (sawInfinity) {
        if (0 != (flags & FLAG_NEGATIVE)) {
            return -INFINITY;
        } else {
            return INFINITY;
        }
    }
    U_ASSERT(!quantity.bogus);
    if (quantity.isZero() && quantity.isNegative()) {
        return -0.0;
    }

    if (quantity.fitsInLong()) {
        return static_cast<double>(quantity.toLong());
    } else {
        return quantity.toDouble();
    }
}